

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr * __thiscall c4::yml::Tree::val_ref(Tree *this,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  NodeData *pNVar4;
  csubstr *pcVar5;
  
  pNVar4 = _p(this,node);
  if (((pNVar4->m_type).type & VALREF) != NOTYPE) {
    pNVar4 = _p(this,node);
    NVar1 = (pNVar4->m_type).type;
    if ((NVar1 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar1 >> 9 & 1) == 0) goto LAB_001d620d;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      pcVar5 = (csubstr *)(*pcVar2)();
      return pcVar5;
    }
  }
  to_csubstr(
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            );
  (*(code *)PTR_error_impl_0022e4f8)
            ("check failed: is_val_ref(node) && ! has_val_anchor(node)",0x38,
             (anonymous_namespace)::s_default_callbacks);
LAB_001d620d:
  pNVar4 = _p(this,node);
  return &(pNVar4->m_val).anchor;
}

Assistant:

csubstr    const& val_ref   (size_t node) const { RYML_ASSERT(is_val_ref(node) && ! has_val_anchor(node)); return _p(node)->m_val.anchor; }